

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestServer.hpp
# Opt level: O3

void __thiscall test_server::TestServer::~TestServer(TestServer *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"terminating child ",0x12);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,
                      (((this->child)._M_t.
                        super___uniq_ptr_impl<boost::process::child,_std::default_delete<boost::process::child>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_boost::process::child_*,_std::default_delete<boost::process::child>_>
                        .super__Head_base<0UL,_boost::process::child_*,_false>._M_head_impl)->
                      _child_handle).pid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::unique_ptr<boost::process::child,_std::default_delete<boost::process::child>_>::~unique_ptr
            (&this->child);
  return;
}

Assistant:

~TestServer() { std::cout << "terminating child " << child->id() << "\n"; }